

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* dgrminer::combinations
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,vector<int,_std::allocator<int>_> *input,
            size_t combination_size)

{
  bool bVar1;
  long lVar2;
  int i;
  ulong __n;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar3;
  vector<int,_std::allocator<int>_> result;
  vector<bool,_std::allocator<bool>_> v;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&v,(long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2,(allocator_type *)&result);
  __last.super__Bit_iterator_base._M_p =
       v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p +
       (long)combination_size / 0x40 +
       ((ulong)((combination_size & 0x800000000000003f) < 0x8000000000000001) - 1);
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._M_offset = (uint)combination_size & 0x3f;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,(bool *)&result);
  do {
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    lVar2 = 0;
    for (__n = 0; __n < (ulong)((long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                      .super__Vector_impl_data._M_finish -
                                (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                      .super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&v,__n);
      if ((*rVar3._M_p & rVar3._M_mask) != 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&result,(value_type_conflict1 *)
                           ((long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar2));
      }
      lVar2 = lVar2 + 4;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,&result);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&result.super__Vector_base<int,_std::allocator<int>_>);
    bVar1 = std::__prev_permutation<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                      (v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                       ._M_start.super__Bit_iterator_base._M_p,0,
                       v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                       ._M_finish.super__Bit_iterator_base._M_p,
                       v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                       ._M_finish.super__Bit_iterator_base._M_offset);
  } while (bVar1);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&v.super__Bvector_base<std::allocator<bool>_>);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> combinations(
		const std::vector<int>& input,
		size_t combination_size
	) {
	  	std::vector<std::vector<int>> results;
	  	std::vector<bool> v(input.size());
	  	std::fill(v.begin(), v.begin() + combination_size, true);

	  	do {
			std::vector<int> result;
			for (int i = 0; i < input.size(); ++i) {
		  		if (v[i]) {
					result.push_back(input[i]);
				}
		  	}
			results.push_back(result);
		} while (std::prev_permutation(v.begin(), v.end()));

	  	return results;
	}